

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O0

void __thiscall FParser::PrintTokens(FParser *this)

{
  int local_14;
  int i;
  FParser *this_local;
  
  for (local_14 = 0; local_14 < this->NumTokens; local_14 = local_14 + 1) {
    Printf("\n\'%s\' \t\t --",this->Tokens[local_14]);
    switch(this->TokenType[local_14]) {
    case name_:
      Printf("name");
      break;
    case number:
      Printf("number");
      break;
    case operator_:
      Printf("operator");
      break;
    case string_:
      Printf("string");
      break;
    case unset:
      Printf("duh");
      break;
    case function:
      Printf("function name");
    }
  }
  Printf("\n");
  if (this->Section != (DFsSection *)0x0) {
    Printf("current section: offset %i\n",(ulong)(uint)this->Section->start_index);
  }
  return;
}

Assistant:

void FParser::PrintTokens()	// DEBUG
{
	int i;
	for (i = 0; i < NumTokens; i++)
	{
		Printf("\n'%s' \t\t --", Tokens[i]);
		switch (TokenType[i])
		{
		case string_:
			Printf("string");
			break;
		case operator_:
			Printf("operator");
			break;
		case name_:
			Printf("name");
			break;
		case number:
			Printf("number");
			break;
		case unset:
			Printf("duh");
			break;
		case function:
			Printf("function name");
			break;
		}
	}
	Printf("\n");
	if (Section)
		Printf("current section: offset %i\n", Section->start_index);
}